

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O0

void __thiscall
trento::WoodsSaxonNucleus::WoodsSaxonNucleus
          (WoodsSaxonNucleus *this,size_t A,double R,double a,double dmin)

{
  anon_class_16_2_94731c38 __fw;
  undefined8 *in_RDI;
  ulong in_XMM0_Qa;
  undefined1 auVar1 [16];
  piecewise_linear_distribution<double> *in_XMM1_Qa;
  double in_XMM2_Qa;
  undefined1 auVar2 [16];
  double in_stack_ffffffffffffffb8;
  MinDistNucleus *in_stack_ffffffffffffffc0;
  
  MinDistNucleus::MinDistNucleus
            (in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8,(double)in_RDI);
  *in_RDI = &PTR__WoodsSaxonNucleus_0016ca30;
  in_RDI[6] = in_XMM0_Qa;
  in_RDI[7] = in_XMM1_Qa;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_XMM1_Qa;
  vfmadd213sd_fma(ZEXT816(0x4024000000000000),auVar2,auVar1);
  __fw.a = (double)in_XMM1_Qa;
  __fw.R = in_XMM2_Qa;
  std::piecewise_linear_distribution<double>::
  piecewise_linear_distribution<trento::WoodsSaxonNucleus::WoodsSaxonNucleus(unsigned_long,double,double,double)::__0>
            (in_XMM1_Qa,in_XMM0_Qa,(double)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,__fw)
  ;
  return;
}

Assistant:

WoodsSaxonNucleus::WoodsSaxonNucleus(
    std::size_t A, double R, double a, double dmin)
    : MinDistNucleus(A, dmin),
      R_(R),
      a_(a),
      woods_saxon_dist_(1000, 0., R + 10.*a,
        [R, a](double r) { return r*r/(1.+std::exp((r-R)/a)); })
{}